

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

int uv__process_init_stdio(uv_stdio_container_t *container,int *fds)

{
  int local_28;
  int fd;
  int mask;
  int *fds_local;
  uv_stdio_container_t *container_local;
  
  switch(container->flags & (UV_INHERIT_STREAM|UV_INHERIT_FD|UV_CREATE_PIPE)) {
  case UV_IGNORE:
    container_local._4_4_ = 0;
    break;
  case UV_CREATE_PIPE:
    if ((container->data).stream == (uv_stream_t *)0x0) {
      __assert_fail("container->data.stream != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                    ,0xbb,"int uv__process_init_stdio(uv_stdio_container_t *, int *)");
    }
    if (((container->data).stream)->type == UV_NAMED_PIPE) {
      container_local._4_4_ = uv_socketpair(1,0,fds,0,0);
    }
    else {
      container_local._4_4_ = -0x16;
    }
    break;
  case UV_INHERIT_FD:
  case UV_INHERIT_STREAM:
    if ((container->flags & UV_INHERIT_FD) == UV_IGNORE) {
      local_28 = (((container->data).stream)->io_watcher).fd;
    }
    else {
      local_28 = (container->data).fd;
    }
    if (local_28 == -1) {
      container_local._4_4_ = -0x16;
    }
    else {
      fds[1] = local_28;
      container_local._4_4_ = 0;
    }
    break;
  default:
    __assert_fail("0 && \"Unexpected flags\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                  ,0xcf,"int uv__process_init_stdio(uv_stdio_container_t *, int *)");
  }
  return container_local._4_4_;
}

Assistant:

static int uv__process_init_stdio(uv_stdio_container_t* container, int fds[2]) {
  int mask;
  int fd;

  mask = UV_IGNORE | UV_CREATE_PIPE | UV_INHERIT_FD | UV_INHERIT_STREAM;

  switch (container->flags & mask) {
  case UV_IGNORE:
    return 0;

  case UV_CREATE_PIPE:
    assert(container->data.stream != NULL);
    if (container->data.stream->type != UV_NAMED_PIPE)
      return UV_EINVAL;
    else
      return uv_socketpair(SOCK_STREAM, 0, fds, 0, 0);

  case UV_INHERIT_FD:
  case UV_INHERIT_STREAM:
    if (container->flags & UV_INHERIT_FD)
      fd = container->data.fd;
    else
      fd = uv__stream_fd(container->data.stream);

    if (fd == -1)
      return UV_EINVAL;

    fds[1] = fd;
    return 0;

  default:
    assert(0 && "Unexpected flags");
    return UV_EINVAL;
  }
}